

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Imputer::SharedDtor(Imputer *this)

{
  bool bVar1;
  Imputer *this_local;
  
  bVar1 = has_ImputedValue(this);
  if (bVar1) {
    clear_ImputedValue(this);
  }
  bVar1 = has_ReplaceValue(this);
  if (bVar1) {
    clear_ReplaceValue(this);
  }
  return;
}

Assistant:

void Imputer::SharedDtor() {
  if (has_ImputedValue()) {
    clear_ImputedValue();
  }
  if (has_ReplaceValue()) {
    clear_ReplaceValue();
  }
}